

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

vector<Token,_std::allocator<Token>_> *
Lexer::tokenize(vector<Token,_std::allocator<Token>_> *__return_storage_ptr__,string *code,
               vector<Token,_std::allocator<Token>_> *verbatim)

{
  bool bVar1;
  Token local_f8;
  undefined1 local_d0 [8];
  Token tk;
  string local_98;
  undefined1 local_78 [8];
  Lexer yylex;
  vector<Token,_std::allocator<Token>_> *verbatim_local;
  string *code_local;
  vector<Token,_std::allocator<Token>_> *tokens;
  
  yylex._80_8_ = verbatim;
  std::__cxx11::string::string((string *)&local_98,(string *)code);
  Lexer((Lexer *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  tk.text.field_2._M_local_buf[0xb] = '\0';
  std::vector<Token,_std::allocator<Token>_>::vector(__return_storage_ptr__);
  Token::Token((Token *)local_d0);
  do {
    operator()(&local_f8,(Lexer *)local_78);
    Token::operator=((Token *)local_d0,&local_f8);
    Token::~Token(&local_f8);
    bVar1 = Token::is((Token *)local_d0,T_TEXT);
    if (bVar1) {
      if (yylex._80_8_ != 0) {
        std::vector<Token,_std::allocator<Token>_>::push_back
                  ((vector<Token,_std::allocator<Token>_> *)yylex._80_8_,(value_type *)local_d0);
      }
    }
    else {
      std::vector<Token,_std::allocator<Token>_>::push_back
                (__return_storage_ptr__,(value_type *)local_d0);
    }
    bVar1 = Token::isNot((Token *)local_d0,T_EOF_SYMBOL);
  } while (bVar1);
  tk.text.field_2._M_local_buf[0xb] = '\x01';
  Token::~Token((Token *)local_d0);
  if ((tk.text.field_2._M_local_buf[0xb] & 1U) == 0) {
    std::vector<Token,_std::allocator<Token>_>::~vector(__return_storage_ptr__);
  }
  ~Lexer((Lexer *)local_78);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Token> Lexer::tokenize(std::string code,
                                   std::vector<Token>* verbatim) {
  Lexer yylex(std::move(code));
  std::vector<Token> tokens;
  Token tk;
  do {
    tk = yylex();
    if (tk.is(T_TEXT)) {
      if (verbatim) verbatim->push_back(std::move(tk));
      continue;
    }
    tokens.push_back(std::move(tk));
  } while (tk.isNot(T_EOF_SYMBOL));
  return tokens;
}